

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonAnalyticalPricer.cpp
# Opt level: O1

complex<double> __thiscall
VarianceSwapsHestonAnalyticalPricer::functionD
          (VarianceSwapsHestonAnalyticalPricer *this,double tau,double omega)

{
  double dVar1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  complex<double> cVar6;
  undefined8 local_68;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  dVar2 = omega;
  dVar1 = HestonModel::getVolOfVol(this->hestonModel_);
  aTerm(this,omega);
  dVar3 = dVar2;
  bTerm(this,omega);
  local_68 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
  dVar4 = dVar3;
  gTerm(this,omega);
  dVar5 = -dVar3 * tau;
  local_18 = cexp(-local_68 * tau);
  local_10 = -dVar5;
  local_18 = 1.0 - local_18;
  local_38 = ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) - local_68) / (dVar1 * dVar1);
  local_30 = (dVar2 - dVar3) / (dVar1 * dVar1);
  std::complex<double>::operator*=((complex<double> *)&local_38,(complex<double> *)&local_18);
  dVar2 = local_30;
  dVar1 = local_38;
  local_20 = -dVar3 * tau;
  local_28 = cexp(-local_68 * tau);
  local_38 = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
  local_30 = dVar4;
  std::complex<double>::operator*=((complex<double> *)&local_38,(complex<double> *)&local_28);
  cVar6._M_value = (_ComplexT)__divdc3(SUB84(dVar1,0),SUB84(dVar2,0),1.0 - local_38,-local_30);
  return (complex<double>)cVar6._M_value;
}

Assistant:

std::complex<double> VarianceSwapsHestonAnalyticalPricer::
functionD(double tau, double omega) const {
    double sigma = hestonModel_->getVolOfVol();
    std::complex<double> a = aTerm(omega), 
                         b = bTerm(omega),
                         g = gTerm(omega);
    std::complex<double> D_init = (a-b)/(sigma*sigma); //definition during class
    return D_init*(1.-std::exp(-b*tau))/(1.-g*std::exp(-b*tau)); // in class
    // return D_init*(1.-std::exp(b*tau))/(1.-g*std::exp(b*tau)); // in PDF
}